

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O0

REF_STATUS
ref_face_open_node(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz3,REF_INT *open_node,
                  REF_DBL *dot)

{
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL open_dot;
  REF_DBL edge2 [3];
  double local_58;
  REF_DBL edge1 [3];
  REF_DBL *dot_local;
  REF_INT *open_node_local;
  REF_DBL *xyz3_local;
  REF_DBL *xyz2_local;
  REF_DBL *xyz1_local;
  REF_DBL *xyz0_local;
  
  local_58 = *xyz0 - *xyz3;
  edge1[0] = xyz0[1] - xyz3[1];
  edge1[1] = xyz0[2] - xyz3[2];
  open_dot = *xyz1 - *xyz0;
  edge2[0] = xyz1[1] - xyz0[1];
  edge2[1] = xyz1[2] - xyz0[2];
  edge1[2] = (REF_DBL)dot;
  xyz0_local._4_4_ = ref_math_normalize(&local_58);
  if (xyz0_local._4_4_ == 0) {
    xyz0_local._4_4_ = ref_math_normalize(&open_dot);
    if (xyz0_local._4_4_ == 0) {
      _ref_private_macro_code_rss_1 =
           edge2[1] * edge1[1] + open_dot * local_58 + edge2[0] * edge1[0];
      *open_node = 0;
      *(double *)edge1[2] = _ref_private_macro_code_rss_1;
      local_58 = *xyz1 - *xyz0;
      edge1[0] = xyz1[1] - xyz0[1];
      edge1[1] = xyz1[2] - xyz0[2];
      open_dot = *xyz2 - *xyz1;
      edge2[0] = xyz2[1] - xyz1[1];
      edge2[1] = xyz2[2] - xyz1[2];
      xyz0_local._4_4_ = ref_math_normalize(&local_58);
      if (xyz0_local._4_4_ == 0) {
        xyz0_local._4_4_ = ref_math_normalize(&open_dot);
        if (xyz0_local._4_4_ == 0) {
          if (_ref_private_macro_code_rss_1 <
              edge2[1] * edge1[1] + open_dot * local_58 + edge2[0] * edge1[0]) {
            _ref_private_macro_code_rss_1 =
                 edge2[1] * edge1[1] + open_dot * local_58 + edge2[0] * edge1[0];
            *open_node = 1;
            *(double *)edge1[2] = _ref_private_macro_code_rss_1;
          }
          local_58 = *xyz2 - *xyz1;
          edge1[0] = xyz2[1] - xyz1[1];
          edge1[1] = xyz2[2] - xyz1[2];
          open_dot = *xyz3 - *xyz2;
          edge2[0] = xyz3[1] - xyz2[1];
          edge2[1] = xyz3[2] - xyz2[2];
          xyz0_local._4_4_ = ref_math_normalize(&local_58);
          if (xyz0_local._4_4_ == 0) {
            xyz0_local._4_4_ = ref_math_normalize(&open_dot);
            if (xyz0_local._4_4_ == 0) {
              if (_ref_private_macro_code_rss_1 <
                  edge2[1] * edge1[1] + open_dot * local_58 + edge2[0] * edge1[0]) {
                _ref_private_macro_code_rss_1 =
                     edge2[1] * edge1[1] + open_dot * local_58 + edge2[0] * edge1[0];
                *open_node = 2;
                *(double *)edge1[2] = _ref_private_macro_code_rss_1;
              }
              local_58 = *xyz3 - *xyz2;
              edge1[0] = xyz3[1] - xyz2[1];
              edge1[1] = xyz3[2] - xyz2[2];
              open_dot = *xyz0 - *xyz3;
              edge2[0] = xyz0[1] - xyz3[1];
              edge2[1] = xyz0[2] - xyz3[2];
              xyz0_local._4_4_ = ref_math_normalize(&local_58);
              if (xyz0_local._4_4_ == 0) {
                xyz0_local._4_4_ = ref_math_normalize(&open_dot);
                if (xyz0_local._4_4_ == 0) {
                  if (_ref_private_macro_code_rss_1 <
                      edge2[1] * edge1[1] + open_dot * local_58 + edge2[0] * edge1[0]) {
                    *open_node = 3;
                    *(double *)edge1[2] =
                         edge2[1] * edge1[1] + open_dot * local_58 + edge2[0] * edge1[0];
                  }
                  xyz0_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c"
                         ,0x132,"ref_face_open_node",(ulong)xyz0_local._4_4_,"e2");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c"
                       ,0x131,"ref_face_open_node",(ulong)xyz0_local._4_4_,"e1");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c"
                     ,0x122,"ref_face_open_node",(ulong)xyz0_local._4_4_,"e2");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
                   0x121,"ref_face_open_node",(ulong)xyz0_local._4_4_,"e1");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
                 0x112,"ref_face_open_node",(ulong)xyz0_local._4_4_,"e2");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
               0x111,"ref_face_open_node",(ulong)xyz0_local._4_4_,"e1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x104,
             "ref_face_open_node",(ulong)xyz0_local._4_4_,"e2");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x103,
           "ref_face_open_node",(ulong)xyz0_local._4_4_,"e1");
  }
  return xyz0_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_face_open_node(REF_DBL *xyz0, REF_DBL *xyz1,
                                      REF_DBL *xyz2, REF_DBL *xyz3,
                                      REF_INT *open_node, REF_DBL *dot) {
  REF_DBL edge1[3], edge2[3];
  REF_DBL open_dot;

  edge1[0] = xyz0[0] - xyz3[0];
  edge1[1] = xyz0[1] - xyz3[1];
  edge1[2] = xyz0[2] - xyz3[2];

  edge2[0] = xyz1[0] - xyz0[0];
  edge2[1] = xyz1[1] - xyz0[1];
  edge2[2] = xyz1[2] - xyz0[2];

  RSS(ref_math_normalize(edge1), "e1");
  RSS(ref_math_normalize(edge2), "e2");
  open_dot = ref_math_dot(edge2, edge1);
  *open_node = 0;
  *dot = open_dot;

  edge1[0] = xyz1[0] - xyz0[0];
  edge1[1] = xyz1[1] - xyz0[1];
  edge1[2] = xyz1[2] - xyz0[2];

  edge2[0] = xyz2[0] - xyz1[0];
  edge2[1] = xyz2[1] - xyz1[1];
  edge2[2] = xyz2[2] - xyz1[2];

  RSS(ref_math_normalize(edge1), "e1");
  RSS(ref_math_normalize(edge2), "e2");
  if (ref_math_dot(edge2, edge1) > open_dot) {
    open_dot = ref_math_dot(edge2, edge1);
    *open_node = 1;
    *dot = open_dot;
  }

  edge1[0] = xyz2[0] - xyz1[0];
  edge1[1] = xyz2[1] - xyz1[1];
  edge1[2] = xyz2[2] - xyz1[2];

  edge2[0] = xyz3[0] - xyz2[0];
  edge2[1] = xyz3[1] - xyz2[1];
  edge2[2] = xyz3[2] - xyz2[2];

  RSS(ref_math_normalize(edge1), "e1");
  RSS(ref_math_normalize(edge2), "e2");
  if (ref_math_dot(edge2, edge1) > open_dot) {
    open_dot = ref_math_dot(edge2, edge1);
    *open_node = 2;
    *dot = open_dot;
  }

  edge1[0] = xyz3[0] - xyz2[0];
  edge1[1] = xyz3[1] - xyz2[1];
  edge1[2] = xyz3[2] - xyz2[2];

  edge2[0] = xyz0[0] - xyz3[0];
  edge2[1] = xyz0[1] - xyz3[1];
  edge2[2] = xyz0[2] - xyz3[2];

  RSS(ref_math_normalize(edge1), "e1");
  RSS(ref_math_normalize(edge2), "e2");
  if (ref_math_dot(edge2, edge1) > open_dot) {
    open_dot = ref_math_dot(edge2, edge1);
    *open_node = 3;
    *dot = open_dot;
  }

  return REF_SUCCESS;
}